

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_string.c
# Opt level: O1

wchar_t archive_string_append_from_wcs(archive_string *as,wchar_t *w,size_t len)

{
  size_t sVar1;
  archive_string *paVar2;
  size_t sVar3;
  ulong uVar4;
  int *piVar5;
  char *pcVar6;
  char *__s;
  ulong uVar7;
  size_t sVar8;
  bool bVar9;
  mbstate_t shift_state;
  wchar_t local_54;
  mbstate_t local_38;
  
  local_38.__count = 0;
  local_38.__value = (_union_27)0x0;
  paVar2 = archive_string_ensure(as,len + as->length + 1);
  local_54 = L'\xffffffff';
  if (paVar2 != (archive_string *)0x0) {
    pcVar6 = as->s;
    sVar8 = as->buffer_length;
    __s = pcVar6 + as->length;
    sVar3 = __ctype_get_mb_cur_max();
    local_54 = L'\0';
    if (len != 0 && *w != L'\0') {
      pcVar6 = pcVar6 + ~sVar3 + sVar8;
      uVar7 = len * 2;
      local_54 = L'\0';
      sVar8 = 1;
      do {
        if (pcVar6 <= __s) {
          as->length = (long)__s - (long)as->s;
          *__s = '\0';
          sVar1 = as->length;
          sVar3 = __ctype_get_mb_cur_max();
          uVar4 = uVar7;
          if (uVar7 <= sVar3) {
            uVar4 = __ctype_get_mb_cur_max();
          }
          paVar2 = archive_string_ensure(as,sVar1 + uVar4 + 1);
          if (paVar2 == (archive_string *)0x0) {
            return L'\xffffffff';
          }
          pcVar6 = as->s;
          __s = pcVar6 + as->length;
          sVar1 = as->buffer_length;
          sVar3 = __ctype_get_mb_cur_max();
          pcVar6 = pcVar6 + ~sVar3 + sVar1;
        }
        sVar3 = wcrtomb(__s,w[sVar8 - 1],&local_38);
        if ((int)sVar3 == -1) {
          piVar5 = __errno_location();
          if (*piVar5 != 0x54) {
            local_54 = L'\xffffffff';
            break;
          }
          *__s = '?';
          __s = __s + 1;
          local_54 = L'\xffffffff';
        }
        else {
          __s = __s + (int)sVar3;
        }
        if (w[sVar8] == L'\0') break;
        uVar7 = uVar7 - 2;
        bVar9 = len != sVar8;
        sVar8 = sVar8 + 1;
      } while (bVar9);
    }
    as->length = (long)__s - (long)as->s;
    *__s = '\0';
  }
  return local_54;
}

Assistant:

int
archive_string_append_from_wcs(struct archive_string *as,
    const wchar_t *w, size_t len)
{
	/* We cannot use the standard wcstombs() here because it
	 * cannot tell us how big the output buffer should be.  So
	 * I've built a loop around wcrtomb() or wctomb() that
	 * converts a character at a time and resizes the string as
	 * needed.  We prefer wcrtomb() when it's available because
	 * it's thread-safe. */
	int n, ret_val = 0;
	char *p;
	char *end;
#if HAVE_WCRTOMB
	mbstate_t shift_state;

	memset(&shift_state, 0, sizeof(shift_state));
#else
	/* Clear the shift state before starting. */
	wctomb(NULL, L'\0');
#endif
	/*
	 * Allocate buffer for MBS.
	 * We need this allocation here since it is possible that
	 * as->s is still NULL.
	 */
	if (archive_string_ensure(as, as->length + len + 1) == NULL)
		return (-1);

	p = as->s + as->length;
	end = as->s + as->buffer_length - MB_CUR_MAX -1;
	while (*w != L'\0' && len > 0) {
		if (p >= end) {
			as->length = p - as->s;
			as->s[as->length] = '\0';
			/* Re-allocate buffer for MBS. */
			if (archive_string_ensure(as,
			    as->length + max(len * 2,
			    (size_t)MB_CUR_MAX) + 1) == NULL)
				return (-1);
			p = as->s + as->length;
			end = as->s + as->buffer_length - MB_CUR_MAX -1;
		}
#if HAVE_WCRTOMB
		n = wcrtomb(p, *w++, &shift_state);
#else
		n = wctomb(p, *w++);
#endif
		if (n == -1) {
			if (errno == EILSEQ) {
				/* Skip an illegal wide char. */
				*p++ = '?';
				ret_val = -1;
			} else {
				ret_val = -1;
				break;
			}
		} else
			p += n;
		len--;
	}
	as->length = p - as->s;
	as->s[as->length] = '\0';
	return (ret_val);
}